

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v8::detail::format_error_code(buffer<char> *out,int error_code,string_view message)

{
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  bool bVar1;
  type tVar2;
  basic_string_view<char> *args_01;
  size_t sVar3;
  uint32_t in_ESI;
  buffer<char> *in_RDI;
  buffer_appender<char> it;
  uint32_or_64_or_128_t<int> abs_value;
  size_t error_code_size;
  buffer<char> *in_stack_fffffffffffffda8;
  appender *in_stack_fffffffffffffdb0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_fffffffffffffdb8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_fffffffffffffdc0;
  bool local_221;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_220;
  unsigned_long_long in_stack_fffffffffffffde8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  size_t in_stack_fffffffffffffe00;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_fffffffffffffe08;
  anon_class_1_0_00000001 local_1ea [2];
  undefined8 local_1e8;
  undefined8 local_1e0;
  size_t local_1d8;
  size_t local_1d0;
  uint32_t local_1c4;
  long local_1c0;
  uint32_t local_1b4;
  buffer<char> *local_1b0;
  basic_string_view<char> local_1a8;
  undefined1 local_198 [40];
  undefined8 local_170;
  undefined1 *local_168;
  size_t local_150;
  char *local_148;
  basic_string_view<char> *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  size_t local_128;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_120;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> local_118;
  undefined8 local_f8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> *local_f0;
  char (*local_d0) [7];
  char *local_c8;
  undefined1 local_c0 [24];
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_a8;
  undefined8 *local_a0;
  undefined1 *local_80;
  undefined8 *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined8 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> *local_30;
  undefined8 *local_28;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> *local_20;
  undefined8 local_18;
  undefined8 *local_10;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> *local_8;
  
  local_1b4 = in_ESI;
  local_1b0 = in_RDI;
  buffer<char>::try_resize
            (in_stack_fffffffffffffdc0.container,(size_t)in_stack_fffffffffffffdb8.container);
  local_1c0 = 8;
  local_1c4 = local_1b4;
  bVar1 = is_negative<int,_0>(local_1b4);
  if (bVar1) {
    local_1c4 = -local_1c4;
    local_1c0 = local_1c0 + 1;
  }
  count_digits(local_1c4);
  tVar2 = to_unsigned<int>(0);
  local_1c0 = local_1c0 + (ulong)tVar2;
  appender::back_insert_iterator(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  args_01 = (basic_string_view<char> *)basic_string_view<char>::size(&local_1a8);
  if (args_01 <= (basic_string_view<char> *)(500U - local_1c0)) {
    local_1d8 = local_1d0;
    format_error_code::anon_class_1_0_00000001::operator()(local_1ea);
    basic_format_string<char,_fmt::v8::basic_string_view<char>_&,_const_char_(&)[3]>::
    basic_format_string<FMT_COMPILE_STRING,_0>
              ((basic_format_string<char,_fmt::v8::basic_string_view<char>_&,_const_char_(&)[3]> *)
               in_stack_fffffffffffffdc0.container,
               (FMT_COMPILE_STRING *)in_stack_fffffffffffffdb8.container);
    local_128 = local_1d8;
    local_138 = local_1e8;
    uStack_130 = local_1e0;
    local_140 = &local_1a8;
    local_148 = ": ";
    local_150 = local_1d8;
    local_a0 = &local_138;
    make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,fmt::v8::basic_string_view<char>,char[3]>
              (args_01,(char (*) [3])in_stack_fffffffffffffdc0.container);
    local_78 = &local_170;
    local_80 = local_198;
    local_68 = 0xcd;
    local_170 = 0xcd;
    fmt.size_ = in_stack_fffffffffffffe00;
    fmt.data_ = in_stack_fffffffffffffdf8;
    args.field_1.values_ = in_stack_fffffffffffffdf0.values_;
    args.desc_ = in_stack_fffffffffffffde8;
    local_70 = local_80;
    local_60 = local_78;
    local_58 = local_80;
    local_168 = local_80;
    in_stack_fffffffffffffdb8.container =
         (buffer<char> *)
         vformat_to<fmt::v8::appender,_0>(in_stack_fffffffffffffe08.container,fmt,args);
    in_stack_fffffffffffffdc0.container = in_stack_fffffffffffffdb8.container;
    in_stack_fffffffffffffe08.container = in_stack_fffffffffffffdb8.container;
    local_120.container = in_stack_fffffffffffffdb8.container;
  }
  format_error_code::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&stack0xfffffffffffffdee);
  basic_format_string<char,_const_char_(&)[7],_int_&>::basic_format_string<FMT_COMPILE_STRING,_0>
            ((basic_format_string<char,_const_char_(&)[7],_int_&> *)
             in_stack_fffffffffffffdc0.container,
             (FMT_COMPILE_STRING *)in_stack_fffffffffffffdb8.container);
  local_c8 = "error ";
  local_d0 = (char (*) [7])&local_1b4;
  local_50 = local_c0;
  make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,char[7],int>
            (&local_118,(v8 *)"error ",local_d0,(int *)in_stack_fffffffffffffdf0.values_);
  local_28 = &local_f8;
  local_30 = &local_118;
  local_18 = 0x1c;
  local_f8 = 0x1c;
  fmt_00.size_ = local_1d0;
  fmt_00.data_ = in_stack_fffffffffffffdf8;
  args_00.field_1.values_ = in_stack_fffffffffffffdf0.values_;
  args_00.desc_ = in_stack_fffffffffffffde8;
  local_20 = local_30;
  local_10 = local_28;
  local_8 = local_30;
  local_f0 = local_30;
  local_220.container =
       (buffer<char> *)
       vformat_to<fmt::v8::appender,_0>(in_stack_fffffffffffffe08.container,fmt_00,args_00);
  local_a8.container = local_220.container;
  sVar3 = buffer<char>::size(local_1b0);
  local_221 = sVar3 < 0x1f5;
  ignore_unused<bool,char[1]>(&local_221,(char (*) [1])0x1c6bb0);
  return;
}

Assistant:

FMT_FUNC void format_error_code(detail::buffer<char>& out, int error_code,
                                string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.try_resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (detail::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += detail::to_unsigned(detail::count_digits(abs_value));
  auto it = buffer_appender<char>(out);
  if (message.size() <= inline_buffer_size - error_code_size)
    format_to(it, FMT_STRING("{}{}"), message, SEP);
  format_to(it, FMT_STRING("{}{}"), ERROR_STR, error_code);
  FMT_ASSERT(out.size() <= inline_buffer_size, "");
}